

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorBase.cpp
# Opt level: O0

void __thiscall
pele::physics::reactions::ReactorBase::set_sundials_solver_tols
          (ReactorBase *this,Context *sunctx,void *sundials_mem,int ncells,Real relTol,Real absTol,
          string *solvername)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int in_ECX;
  long in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int flag;
  int i_1;
  int k;
  int offset;
  int i;
  Real *ratol;
  N_Vector atol;
  int neq_tot;
  int omp_thread;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  Print *in_stack_fffffffffffffbf0;
  Print *in_stack_fffffffffffffbf8;
  Print *in_stack_fffffffffffffc00;
  Print *in_stack_fffffffffffffc08;
  ostream *in_stack_fffffffffffffc18;
  Print *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc60;
  int local_38c;
  ostream local_388 [392];
  int local_200;
  int local_1fc;
  int local_1f8;
  realtype *local_60;
  N_Vector local_58;
  int local_50;
  int local_4c;
  realtype local_40;
  int local_2c;
  char *local_10;
  char *local_8;
  
  local_40 = (realtype)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_4c = 0;
  iVar2 = in_ECX * 0x16;
  local_50 = iVar2;
  local_2c = in_ECX;
  sundials::Context::operator_cast_to__SUNContext_((Context *)0x30ee52);
  local_58 = N_VNew_Serial((sunindextype)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                           (SUNContext)in_stack_fffffffffffffbf0);
  local_60 = N_VGetArrayPointer((N_Vector)0x30ee73);
  pvVar3 = std::array<double,_22UL>::operator[]
                     ((array<double,_22UL> *)in_stack_fffffffffffffbf0,
                      (size_type)in_stack_fffffffffffffbe8);
  if (*pvVar3 <= 0.0) {
    if ((0 < *(int *)(in_RDI + 8)) && (local_4c == 0)) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffffc20,local_388);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(char (*) [10])in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc08 =
           amrex::Print::operator<<
                     (in_stack_fffffffffffffbf0,(char (*) [20])in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc00 =
           amrex::Print::operator<<(in_stack_fffffffffffffbf0,(double *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffbf8 =
           amrex::Print::operator<<
                     (in_stack_fffffffffffffbf0,(char (*) [9])in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffbf0 =
           amrex::Print::operator<<(in_stack_fffffffffffffbf0,(double *)in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(char (*) [18])in_stack_fffffffffffffbe8);
      amrex::Print::~Print((Print *)CONCAT44(iVar2,in_stack_fffffffffffffc60));
    }
    for (local_38c = 0; local_38c < local_50; local_38c = local_38c + 1) {
      local_60[local_38c] = local_40;
    }
  }
  else {
    if ((0 < *(int *)(in_RDI + 8)) && (local_4c == 0)) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(char (*) [10])in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(char (*) [33])in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(double *)in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(char (*) [13])in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(double *)in_stack_fffffffffffffbe8);
      amrex::Print::operator<<(in_stack_fffffffffffffbf0,(char (*) [18])in_stack_fffffffffffffbe8);
      amrex::Print::~Print((Print *)CONCAT44(iVar2,in_stack_fffffffffffffc60));
    }
    for (local_1f8 = 0; local_1f8 < local_2c; local_1f8 = local_1f8 + 1) {
      local_1fc = local_1f8 * 0x16;
      for (local_200 = 0; local_200 < 0x16; local_200 = local_200 + 1) {
        pvVar3 = std::array<double,_22UL>::operator[]
                           ((array<double,_22UL> *)in_stack_fffffffffffffbf0,
                            (size_type)in_stack_fffffffffffffbe8);
        local_60[local_1fc + local_200] = *pvVar3 * local_40;
      }
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  if (bVar1) {
    CVodeSVtolerances(in_stack_fffffffffffffc08,(realtype)in_stack_fffffffffffffc00,
                      (N_Vector)in_stack_fffffffffffffbf8);
    iVar2 = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    if (bVar1) {
      ARKStepSVtolerances(in_stack_fffffffffffffbf8,(realtype)in_stack_fffffffffffffbf0,
                          (N_Vector)in_stack_fffffffffffffbe8);
      iVar2 = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      if (bVar1) {
        ERKStepSVtolerances(in_stack_fffffffffffffbf8,(realtype)in_stack_fffffffffffffbf0,
                            (N_Vector)in_stack_fffffffffffffbe8);
        iVar2 = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
      }
      else {
        local_8 = "setSundialsSolverTols not implemented for this solver type";
        amrex::Abort_host((char *)in_stack_fffffffffffffc00);
        iVar2 = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
      }
    }
  }
  iVar2 = utils::check_flag(in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,iVar2);
  if (iVar2 != 0) {
    local_10 = "Problem in setSundialsSolverTols";
    amrex::Abort_host((char *)in_stack_fffffffffffffc00);
  }
  N_VDestroy((N_Vector)0x30f2fd);
  return;
}

Assistant:

void
ReactorBase::set_sundials_solver_tols(
  // cppcheck-suppress constParameter
  sundials::Context& sunctx,
  void* sundials_mem,
  const int ncells,
  const amrex::Real relTol,
  const amrex::Real absTol,
  const std::string& solvername)
{
  int omp_thread = 0;
#ifdef AMREX_USE_OMP
  omp_thread = omp_get_thread_num();
#endif

  const int neq_tot = (NUM_SPECIES + 1) * ncells;

#if defined(AMREX_USE_CUDA)
  N_Vector atol = N_VNewWithMemHelp_Cuda(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_Vector atol = N_VNewWithMemHelp_Hip(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_Vector atol = N_VNewWithMemHelp_Sycl(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(),
    &amrex::Gpu::Device::streamQueue(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Sycl(atol);
#else
  N_Vector atol = N_VNew_Serial(neq_tot, sunctx);
  amrex::Real* ratol = N_VGetArrayPointer(atol);
#endif

  if (m_typ_vals[0] > 0.0) {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances with TypVals rtol = " << relTol
                     << " atolfact = " << absTol << " in PelePhysics \n";
    }
    for (int i = 0; i < ncells; i++) {
      const int offset = i * (NUM_SPECIES + 1);
      for (int k = 0; k < NUM_SPECIES + 1; k++) {
        ratol[offset + k] = m_typ_vals[k] * absTol;
      }
    }
  } else {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances rtol = " << relTol << " atol = " << absTol
                     << " in PelePhysics \n";
    }
    for (int i = 0; i < neq_tot; i++) {
      ratol[i] = absTol;
    }
  }

#if defined(AMREX_USE_CUDA)
  N_VCopyToDevice_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_VCopyToDevice_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_VCopyToDevice_Sycl(atol);
#endif

  // Call CVodeSVtolerances to specify the scalar relative tolerance
  // and vector absolute tolerances
  int flag;
  if (solvername == "cvode") {
    flag = CVodeSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "arkstep") {
    flag = ARKStepSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "erkstep") {
    flag = ERKStepSVtolerances(sundials_mem, relTol, atol);
  } else {
    amrex::Abort("setSundialsSolverTols not implemented for this solver type");
  }
  if (utils::check_flag(&flag, "SVtolerances", 1) != 0) {
    amrex::Abort("Problem in setSundialsSolverTols");
  }

  N_VDestroy(atol);
}